

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O0

void __thiscall sparse_parameters::sparse_parameters(sparse_parameters *this)

{
  float *pfVar1;
  sparse_parameters *in_RDI;
  size_t in_stack_00000198;
  
  *(undefined8 *)&(in_RDI->_map)._M_h._M_rehash_policy = 0;
  (in_RDI->_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (in_RDI->_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (in_RDI->_map)._M_h._M_element_count = 0;
  (in_RDI->_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (in_RDI->_map)._M_h._M_bucket_count = 0;
  (in_RDI->_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  ::unordered_map((unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
                   *)0x128926);
  in_RDI->_weight_mask = 0;
  in_RDI->_stride_shift = 0;
  in_RDI->_seeded = false;
  in_RDI->_delete = false;
  in_RDI->default_data = (void *)0x0;
  in_RDI->fun = (_func_void_weight_ptr_void_ptr *)0x0;
  stride(in_RDI);
  pfVar1 = calloc_or_throw<float>(in_stack_00000198);
  in_RDI->default_value = pfVar1;
  return;
}

Assistant:

sparse_parameters()
      : _map(), _weight_mask(0), _stride_shift(0), _seeded(false), _delete(false), default_data(nullptr), fun(nullptr)
  {
    default_value = calloc_mergable_or_throw<weight>(stride());
  }